

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_try_send(uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,uint addrlen)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  ssize_t size;
  msghdr h;
  int err;
  uint addrlen_local;
  sockaddr *addr_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_udp_t *handle_local;
  
  h._52_4_ = addrlen;
  if (nbufs == 0) {
    __assert_fail("nbufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                  ,0x2d5,
                  "int uv__udp_try_send(uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int)"
                 );
  }
  if (handle->send_queue_count == 0) {
    if (addr == (sockaddr *)0x0) {
      if ((handle->flags & 0x2000000) == 0) {
        __assert_fail("handle->flags & UV_HANDLE_UDP_CONNECTED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                      ,0x2e0,
                      "int uv__udp_try_send(uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int)"
                     );
      }
    }
    else {
      iVar1 = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0);
      if (iVar1 != 0) {
        return iVar1;
      }
      h.msg_flags = 0;
    }
    memset(&size,0,0x38);
    h.msg_name._0_4_ = h._52_4_;
    h.msg_iov = (iovec *)(ulong)nbufs;
    size = (ssize_t)addr;
    h._8_8_ = bufs;
    do {
      sVar2 = sendmsg((handle->io_watcher).fd,(msghdr *)&size,0);
      bVar4 = false;
      if (sVar2 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if (sVar2 == -1) {
      piVar3 = __errno_location();
      if (((*piVar3 == 0xb) || (piVar3 = __errno_location(), *piVar3 == 0xb)) ||
         (piVar3 = __errno_location(), *piVar3 == 0x69)) {
        handle_local._4_4_ = -0xb;
      }
      else {
        piVar3 = __errno_location();
        handle_local._4_4_ = -*piVar3;
      }
    }
    else {
      handle_local._4_4_ = (int)sVar2;
    }
  }
  else {
    handle_local._4_4_ = -0xb;
  }
  return handle_local._4_4_;
}

Assistant:

int uv__udp_try_send(uv_udp_t* handle,
                     const uv_buf_t bufs[],
                     unsigned int nbufs,
                     const struct sockaddr* addr,
                     unsigned int addrlen) {
  int err;
  struct msghdr h;
  ssize_t size;

  assert(nbufs > 0);

  /* already sending a message */
  if (handle->send_queue_count != 0)
    return UV_EAGAIN;

  if (addr) {
    err = uv__udp_maybe_deferred_bind(handle, addr->sa_family, 0);
    if (err)
      return err;
  } else {
    assert(handle->flags & UV_HANDLE_UDP_CONNECTED);
  }

  memset(&h, 0, sizeof h);
  h.msg_name = (struct sockaddr*) addr;
  h.msg_namelen = addrlen;
  h.msg_iov = (struct iovec*) bufs;
  h.msg_iovlen = nbufs;

  do {
    size = sendmsg(handle->io_watcher.fd, &h, 0);
  } while (size == -1 && errno == EINTR);

  if (size == -1) {
    if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
      return UV_EAGAIN;
    else
      return UV__ERR(errno);
  }

  return size;
}